

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O3

void __thiscall Js::ProbeContainer::DestroyLocation(ProbeContainer *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DebugManager *pDVar4;
  int offset;
  
  Output::Trace(DebuggerPhase,
                L"ProbeContainer::DestroyLocation (start): this=%p, IsNextStatementChanged=%d, haltCallbackProbe=%p\n"
                ,this,(ulong)this->IsNextStatementChanged,this->haltCallbackProbe);
  if (this->IsNextStatementChanged == true) {
    offset = this->bytecodeOffset;
    pDVar4 = this->debugManager;
    if (offset == (pDVar4->stepController).byteOffset) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/ProbeContainer.cpp"
                                  ,0xe1,
                                  "(bytecodeOffset != debugManager->stepController.byteOffset)",
                                  "bytecodeOffset != debugManager->stepController.byteOffset");
      if (!bVar2) goto LAB_008c6e0b;
      *puVar3 = 0;
      pDVar4 = this->debugManager;
      offset = this->bytecodeOffset;
    }
    InterpreterHaltState::SetCurrentOffset(pDVar4->pCurrentInterpreterLocation,offset);
    this->IsNextStatementChanged = false;
  }
  this->framePointers = (DiagStack *)0x0;
  this->jsExceptionObject = (Var)0x0;
  pDVar4 = this->debugManager;
  if (pDVar4 == (DebugManager *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/ProbeContainer.cpp"
                                ,0xee,"(debugManager)","debugManager");
    if (!bVar2) {
LAB_008c6e0b:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    pDVar4 = this->debugManager;
  }
  DebugManager::UnsetCurrentInterpreterLocation(pDVar4);
  JsUtil::
  List<const_Js::PropertyRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  Reset(this->pinnedPropertyRecords);
  if (this->haltCallbackProbe != (HaltCallback *)0x0) {
    (*this->haltCallbackProbe->_vptr_HaltCallback[2])();
    return;
  }
  return;
}

Assistant:

void ProbeContainer::DestroyLocation()
    {
        OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::DestroyLocation (start): this=%p, IsNextStatementChanged=%d, haltCallbackProbe=%p\n"),
            this, this->IsNextStatementChanged, haltCallbackProbe);

        if (IsNextStatementChanged)
        {
            Assert(bytecodeOffset != debugManager->stepController.byteOffset);
            // Note: when we dispatching an exception bytecodeOffset would be same as pProbeManager->pCurrentInterpreterLocation->GetCurrentOffset().

            debugManager->pCurrentInterpreterLocation->SetCurrentOffset(bytecodeOffset);
            IsNextStatementChanged = false;
        }

        framePointers = nullptr;

        // Reset the exception object.

        jsExceptionObject = nullptr;

        Assert(debugManager);
        debugManager->UnsetCurrentInterpreterLocation();

        pinnedPropertyRecords->Reset();

        // Guarding if the probe engine goes away when we are sitting at breakpoint.
        if (haltCallbackProbe)
        {
            // The clean up is called here to scriptengine's object to remove all DebugStackFrames
            haltCallbackProbe->CleanupHalt();
        }
    }